

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

locateresult __thiscall
tetgenmesh::locate(tetgenmesh *this,point searchpt,triface *searchtet,int chkencflag)

{
  int iVar1;
  tetrahedron pc;
  undefined1 auVar2 [16];
  long lVar3;
  int *piVar4;
  tetrahedron *pppdVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  tetrahedron pc_00;
  tetrahedron ppdVar11;
  tetrahedron pb;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (searchtet->tet == (tetrahedron *)0x0) {
    searchtet->tet = (this->recenttet).tet;
  }
  if (searchtet->tet[7] == (tetrahedron)this->dummypoint) {
    searchtet->ver = 3;
    ppdVar11 = searchtet->tet[3];
    uVar7 = (uint)ppdVar11 & 0xf;
    searchtet->ver = uVar7;
    searchtet->tet = (tetrahedron *)((ulong)ppdVar11 & 0xfffffffffffffff0);
    searchtet->ver = fsymtbl[3][uVar7];
  }
  searchtet->ver = 0;
  iVar8 = 0;
  do {
    pppdVar5 = searchtet->tet;
    ppdVar11 = pppdVar5[orgpivot[iVar8]];
    pb = pppdVar5[destpivot[iVar8]];
    pc_00 = pppdVar5[apexpivot[iVar8]];
    dVar13 = orient3d((double *)ppdVar11,(double *)pb,(double *)pc_00,searchpt);
    if (dVar13 < 0.0) break;
    iVar1 = searchtet->ver;
    iVar8 = iVar1 + 1;
    searchtet->ver = iVar8;
  } while (iVar1 < 3);
  if (searchtet->ver == 4) {
    puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
    puts("  the message above, your input data set, and the exact");
    puts("  command line you used to run this program, thank you.");
    exit(2);
  }
  pppdVar5 = searchtet->tet;
  lVar3 = (long)searchtet->ver;
  iVar8 = oppopivot[lVar3];
  do {
    pc = pppdVar5[iVar8];
    if (pc == (tetrahedron)searchpt) {
      iVar8 = esymtbl[lVar3];
      searchtet->ver = iVar8;
      searchtet->ver = eprevtbl[iVar8];
      return ONVERTEX;
    }
    dVar13 = orient3d((double *)pb,(double *)pc_00,(double *)pc,searchpt);
    dVar14 = orient3d((double *)pc_00,(double *)ppdVar11,(double *)pc,searchpt);
    dVar15 = orient3d((double *)ppdVar11,(double *)pb,(double *)pc,searchpt);
    if (0.0 <= dVar13) {
      if (0.0 <= dVar14) {
        if (0.0 <= dVar15) {
          if ((dVar13 != 0.0) || (NAN(dVar13))) {
            if ((dVar14 != 0.0) || (NAN(dVar14))) {
              if ((dVar15 != 0.0) || (NAN(dVar15))) {
                return INTETRAHEDRON;
              }
              searchtet->ver = esymtbl[searchtet->ver];
            }
            else {
              lVar3 = (long)eprevesymtbl[searchtet->ver];
              searchtet->ver = eprevesymtbl[searchtet->ver];
              if ((dVar15 == 0.0) && (!NAN(dVar15))) {
                piVar4 = eprevtbl;
                goto LAB_00121dc6;
              }
            }
          }
          else {
            lVar3 = (long)enextesymtbl[searchtet->ver];
            searchtet->ver = enextesymtbl[searchtet->ver];
            if ((dVar14 == 0.0) && (!NAN(dVar14))) {
              searchtet->ver = eprevtbl[lVar3];
              return (dVar15 == 0.0) + ONEDGE;
            }
            if ((dVar15 == 0.0) && (!NAN(dVar15))) {
              piVar4 = enexttbl;
LAB_00121dc6:
              searchtet->ver = piVar4[lVar3];
              return ONEDGE;
            }
          }
          return ONFACE;
        }
LAB_00121be7:
        bVar6 = 0;
        goto LAB_00121bf4;
      }
      if (0.0 <= dVar15) {
LAB_00121beb:
        bVar12 = true;
      }
      else {
        uVar10 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
        this->randomseed = uVar10;
        bVar12 = (bool)((byte)uVar10 & 1);
      }
      bVar6 = 0;
    }
    else {
      if (0.0 <= dVar14) {
        if (dVar15 < 0.0) {
          uVar10 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
          this->randomseed = uVar10;
          bVar6 = (byte)uVar10 & 1;
          goto LAB_00121bf4;
        }
      }
      else {
        if (0.0 <= dVar15) {
          uVar10 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
          this->randomseed = uVar10;
          bVar6 = (byte)uVar10 & 1;
          bVar12 = (uVar10 & 1) == 0;
          goto LAB_00121bf6;
        }
        uVar10 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar10;
        this->randomseed = uVar10;
        iVar8 = (int)uVar10 + SUB164(auVar2 * ZEXT816(0x5555555555555556),8) * -3;
        if (iVar8 != 0) {
          if (iVar8 == 1) goto LAB_00121beb;
          goto LAB_00121be7;
        }
      }
      bVar6 = 1;
LAB_00121bf4:
      bVar12 = false;
    }
LAB_00121bf6:
    piVar4 = esymtbl;
    if (bVar12 != false) {
      piVar4 = eprevesymtbl;
    }
    if (bVar6 != 0) {
      piVar4 = enextesymtbl;
    }
    searchtet->ver = piVar4[searchtet->ver];
    if (((chkencflag != 0) && (searchtet->tet[9] != (tetrahedron)0x0)) &&
       (searchtet->tet[9][searchtet->ver & 3] != (double *)0x0)) {
      return ENCSUBFACE;
    }
    uVar7 = searchtet->ver;
    ppdVar11 = searchtet->tet[uVar7 & 3];
    uVar9 = (uint)ppdVar11 & 0xf;
    searchtet->ver = uVar9;
    pppdVar5 = (tetrahedron *)((ulong)ppdVar11 & 0xfffffffffffffff0);
    searchtet->tet = pppdVar5;
    iVar8 = fsymtbl[(int)uVar7][uVar9];
    searchtet->ver = iVar8;
    if (pppdVar5[oppopivot[iVar8]] == (tetrahedron)this->dummypoint) {
      return OUTSIDE;
    }
    ppdVar11 = pppdVar5[orgpivot[iVar8]];
    pb = pppdVar5[destpivot[iVar8]];
    pc_00 = pppdVar5[apexpivot[iVar8]];
    pppdVar5 = searchtet->tet;
    lVar3 = (long)searchtet->ver;
    iVar8 = oppopivot[lVar3];
  } while( true );
}

Assistant:

enum tetgenmesh::locateresult 
  tetgenmesh::locate(point searchpt, triface* searchtet, int chkencflag)
{
  point torg, tdest, tapex, toppo;
  enum {ORGMOVE, DESTMOVE, APEXMOVE} nextmove;
  REAL ori, oriorg, oridest, oriapex;
  enum locateresult loc = OUTSIDE;
  int t1ver;
  int s;

  if (searchtet->tet == NULL) {
    // A null tet. Choose the recenttet as the starting tet.
    searchtet->tet = recenttet.tet;
  }

  // Check if we are in the outside of the convex hull.
  if (ishulltet(*searchtet)) {
    // Get its adjacent tet (inside the hull).
    searchtet->ver = 3;
    fsymself(*searchtet);
  }

  // Let searchtet be the face such that 'searchpt' lies above to it.
  for (searchtet->ver = 0; searchtet->ver < 4; searchtet->ver++) {
    torg = org(*searchtet);
    tdest = dest(*searchtet);
    tapex = apex(*searchtet);
    ori = orient3d(torg, tdest, tapex, searchpt); 
    if (ori < 0.0) break;
  }
  if (searchtet->ver == 4) {
    terminatetetgen(this, 2);
  }

  // Walk through tetrahedra to locate the point.
  while (true) {

    toppo = oppo(*searchtet);
    
    // Check if the vertex is we seek.
    if (toppo == searchpt) {
      // Adjust the origin of searchtet to be searchpt.
      esymself(*searchtet);
      eprevself(*searchtet);
      loc = ONVERTEX; // return ONVERTEX;
      break;
    }

    // We enter from one of serarchtet's faces, which face do we exit?
    oriorg = orient3d(tdest, tapex, toppo, searchpt); 
    oridest = orient3d(tapex, torg, toppo, searchpt);
    oriapex = orient3d(torg, tdest, toppo, searchpt);

    // Now decide which face to move. It is possible there are more than one
    //   faces are viable moves. If so, randomly choose one.
    if (oriorg < 0) {
      if (oridest < 0) {
        if (oriapex < 0) {
          // All three faces are possible.
          s = randomnation(3); // 's' is in {0,1,2}.
          if (s == 0) {
            nextmove = ORGMOVE;
          } else if (s == 1) {
            nextmove = DESTMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Two faces, opposite to origin and destination, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = ORGMOVE;
          } else {
            nextmove = DESTMOVE;
          }
        }
      } else {
        if (oriapex < 0) {
          // Two faces, opposite to origin and apex, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = ORGMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Only the face opposite to origin is viable.
          nextmove = ORGMOVE;
        }
      }
    } else {
      if (oridest < 0) {
        if (oriapex < 0) {
          // Two faces, opposite to destination and apex, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = DESTMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Only the face opposite to destination is viable.
          nextmove = DESTMOVE;
        }
      } else {
        if (oriapex < 0) {
          // Only the face opposite to apex is viable.
          nextmove = APEXMOVE;
        } else {
          // The point we seek must be on the boundary of or inside this
          //   tetrahedron. Check for boundary cases.
          if (oriorg == 0) {
            // Go to the face opposite to origin.
            enextesymself(*searchtet);
            if (oridest == 0) {
              eprevself(*searchtet); // edge oppo->apex
              if (oriapex == 0) {
                // oppo is duplicated with p.
                loc = ONVERTEX; // return ONVERTEX;
                break;
              }
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            if (oriapex == 0) {
              enextself(*searchtet); // edge dest->oppo
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            loc = ONFACE; // return ONFACE;
            break;
          }
          if (oridest == 0) {
            // Go to the face opposite to destination.
            eprevesymself(*searchtet);
            if (oriapex == 0) {
              eprevself(*searchtet); // edge oppo->org
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            loc = ONFACE; // return ONFACE;
            break;
          }
          if (oriapex == 0) {
            // Go to the face opposite to apex
            esymself(*searchtet);
            loc = ONFACE; // return ONFACE;
            break;
          }
          loc = INTETRAHEDRON; // return INTETRAHEDRON;
          break;
        }
      }
    }
    
    // Move to the selected face.
    if (nextmove == ORGMOVE) {
      enextesymself(*searchtet);
    } else if (nextmove == DESTMOVE) {
      eprevesymself(*searchtet);
    } else {
      esymself(*searchtet);
    }
    if (chkencflag) {
      // Check if we are walking across a subface.
      if (issubface(*searchtet)) {
        loc = ENCSUBFACE;
        break;
      }
    }
    // Move to the adjacent tetrahedron (maybe a hull tetrahedron).
    fsymself(*searchtet);
    if (oppo(*searchtet) == dummypoint) {
      loc = OUTSIDE; // return OUTSIDE;
      break;
    }

    // Retreat the three vertices of the base face.
    torg = org(*searchtet);
    tdest = dest(*searchtet);
    tapex = apex(*searchtet);

  } // while (true)

  return loc;
}